

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O1

void __thiscall
perfetto::EventContext::AddDebugAnnotation<unsigned_int_const&>
          (EventContext *this,char *name,uint *value)

{
  DebugAnnotation *annotation;
  TracedValue local_30;
  
  if ((this->tls_state_ == (TrackEventTlsState *)0x0) ||
     (this->tls_state_->filter_debug_annotations == false)) {
    annotation = AddDebugAnnotation(this,name);
    internal::CreateTracedValueFromProto(annotation,this);
    WriteIntoTracedValue<unsigned_int_const&>(&local_30,value);
    TracedValue::~TracedValue(&local_30);
  }
  return;
}

Assistant:

void AddDebugAnnotation(const char* name, T&& value) {
    if (tls_state_ && tls_state_->filter_debug_annotations)
      return;
    auto annotation = AddDebugAnnotation(name);
    WriteIntoTracedValue(internal::CreateTracedValueFromProto(annotation, this),
                         std::forward<T>(value));
  }